

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

void violated(int cdt)

{
  char cVar1;
  permonst *ppVar2;
  int cdt_local;
  
  switch(cdt) {
  case 0:
    u.uconduct.killer = u.uconduct.killer + 1;
    if (u.roleplay.pacifist != '\0') {
      pline("You feel violent!");
      cVar1 = yn_function("Do you want to quit?","yn",'n');
      if (cVar1 == 'y') {
        killer_format = 2;
        killer = "quit after an act of violence";
        done(0xe);
      }
      if (9 < u.uconduct.killer) {
        u.roleplay.pacifist = '\0';
      }
    }
    break;
  default:
    impossible("violated: unknown conduct");
    break;
  case 3:
    u.uconduct.armoruses = u.uconduct.armoruses + 1;
    if (u.roleplay.nudist != '\0') {
      pline("You realize you were nude.");
      makemon(mons + 0xe1,level,(int)u.ux,(int)u.uy,0);
      mksobj_at(0x116,level,(int)u.ux,(int)u.uy,'\0','\0');
      u.roleplay.nudist = '\0';
    }
    break;
  case 4:
    u.uconduct.unblinded = u.uconduct.unblinded + 1;
    if (u.roleplay.blindfolded != '\0') {
      pline("The Spirit of Zen leaves your body.");
      ppVar2 = mkclass(&level->z,'4',0);
      makemon(ppVar2,level,(int)u.ux,(int)u.uy,0);
      ppVar2 = mkclass(&level->z,'\x05',0);
      makemon(ppVar2,level,(int)u.ux,(int)u.uy,0);
      ppVar2 = mkclass(&level->z,'\x0e',0);
      makemon(ppVar2,level,(int)u.ux,(int)u.uy,0);
      u.roleplay.blindfolded = '\0';
    }
    break;
  case 5:
    if (u.roleplay.ascet != '\0') {
      pline("You feel a little bit guilty.");
    }
    u.uconduct.food = u.uconduct.food + 1;
    if (9 < u.uconduct.food) {
      u.roleplay.ascet = '\0';
    }
    break;
  case 6:
    if (u.roleplay.vegan != '\0') {
      pline("You feel a bit guilty.");
    }
    u.uconduct.unvegan = u.uconduct.unvegan + 1;
    u.uconduct.food = u.uconduct.food + 1;
    if (0x13 < u.uconduct.unvegan) {
      u.roleplay.vegan = '\0';
    }
    if (9 < u.uconduct.food) {
      u.roleplay.ascet = '\0';
    }
    break;
  case 7:
    if (u.roleplay.vegetarian != '\0') {
      pline("You feel guilty.");
    }
    if (urole.malenum == 0x160) {
      adjalign(-1);
    }
    u.uconduct.unvegetarian = u.uconduct.unvegetarian + 1;
    u.uconduct.unvegan = u.uconduct.unvegan + 1;
    u.uconduct.food = u.uconduct.food + 1;
    if (0x1d < u.uconduct.unvegetarian) {
      u.roleplay.vegetarian = '\0';
    }
    if (0x13 < u.uconduct.unvegan) {
      u.roleplay.vegan = '\0';
    }
    if (9 < u.uconduct.food) {
      u.roleplay.ascet = '\0';
    }
    break;
  case 8:
    u.uconduct.literate = u.uconduct.literate + 1;
    if (u.roleplay.illiterate != '\0') {
      pline("Literatally literature for literate illiterates!");
      exercise(2,'\x01');
    }
    break;
  case 9:
    u.uconduct.robbed = u.uconduct.robbed + 1;
    if (urole.malenum == 0x164) {
      pline("You feel like an ordinary robber.");
    }
  }
  return;
}

Assistant:

void violated(int cdt)
{
	switch (cdt) {
	case CONDUCT_PACIFISM:
	    u.uconduct.killer++;
	    if (u.roleplay.pacifist) {
		pline("You feel violent!");
		if (yn("Do you want to quit?") == 'y') {
		    killer_format = NO_KILLER_PREFIX;
		    killer = "quit after an act of violence";
		    done(QUIT);
		}
		if (u.uconduct.killer >= 10) u.roleplay.pacifist = FALSE;
	    }
	    break;

	case CONDUCT_NUDISM:
	    u.uconduct.armoruses++;
	    if (u.roleplay.nudist) {
		pline("You realize you were nude.");
		makemon(&mons[PM_COBRA], level, u.ux, u.uy, NO_MM_FLAGS);
		mksobj_at(APPLE, level, u.ux, u.uy, FALSE, FALSE);
		u.roleplay.nudist = FALSE;
	    }
	    break;

	case CONDUCT_BLINDFOLDED:
	    u.uconduct.unblinded++;
	    if (u.roleplay.blindfolded) {
		pline("The Spirit of Zen leaves your body.");
		makemon(mkclass(&level->z, S_ZOMBIE, 0),
			level, u.ux, u.uy, NO_MM_FLAGS);	/* Z */
		makemon(mkclass(&level->z, S_EYE, 0),
			level, u.ux, u.uy, NO_MM_FLAGS);	/* e */
		makemon(mkclass(&level->z, S_NYMPH, 0),
			level, u.ux, u.uy, NO_MM_FLAGS);	/* n */
		u.roleplay.blindfolded = FALSE;
	    }
	    break;

	case CONDUCT_VEGETARIAN:	/* replaces violated_vegetarian() */
	    if (u.roleplay.vegetarian)
		pline("You feel guilty.");
	    if (Role_if(PM_MONK))
		adjalign(-1);
	    u.uconduct.unvegetarian++;
	    u.uconduct.unvegan++;
	    u.uconduct.food++;
	    if (u.uconduct.unvegetarian >= 30) u.roleplay.vegetarian = FALSE;
	    if (u.uconduct.unvegan >= 20) u.roleplay.vegan = FALSE;
	    if (u.uconduct.food >= 10) u.roleplay.ascet = FALSE;
	    break;

	case CONDUCT_VEGAN:
	    if (u.roleplay.vegan)
		pline("You feel a bit guilty.");
	    u.uconduct.unvegan++;
	    u.uconduct.food++;
	    if (u.uconduct.unvegan >= 20) u.roleplay.vegan = FALSE;
	    if (u.uconduct.food >= 10) u.roleplay.ascet = FALSE;
	    break;

	case CONDUCT_FOODLESS:
	    if (u.roleplay.ascet)
		pline("You feel a little bit guilty.");
	    u.uconduct.food++;
	    if (u.uconduct.food >= 10) u.roleplay.ascet = FALSE;
	    break;

	case CONDUCT_ILLITERACY:
	    u.uconduct.literate++;
	    if (u.roleplay.illiterate) {
		/* should be impossible */
		pline("Literatally literature for literate illiterates!");
		exercise(A_WIS, TRUE);
	    }
	    break;

	case CONDUCT_THIEVERY:
	    u.uconduct.robbed++;
	    if (Role_if(PM_ROGUE))
		pline("You feel like an ordinary robber.");
	    break;

	default:
	    impossible("violated: unknown conduct");
	}
}